

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdUpdateWitnessStack
              (void *handle,void *create_handle,int stack_type,char *txid,uint32_t vout,
              uint32_t stack_index,char *stack_item)

{
  Transaction *pTVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  string *message;
  char *in_RCX;
  int in_EDX;
  long in_RSI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  char *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  uint32_t index_1;
  ConfidentialTransactionContext *tx_1;
  uint32_t index;
  TransactionContext *tx;
  bool is_bitcoin;
  Txid txid_obj;
  CfdCapiTransactionData *tx_data;
  int result;
  string *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  CfdError error_code;
  allocator *paVar5;
  CfdException *in_stack_fffffffffffffbe0;
  ConfidentialTransaction *pCVar6;
  bool *in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc24;
  undefined6 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcce;
  allocator in_stack_fffffffffffffccf;
  void *in_stack_fffffffffffffcd0;
  CfdSourceLocation local_310;
  allocator local_2f1;
  string local_2f0;
  ByteData local_2d0;
  ScriptWitness local_2b8;
  allocator local_291;
  string local_290;
  ByteData local_270;
  ScriptWitness local_258;
  OutPoint local_238;
  uint32_t local_20c;
  ConfidentialTransaction *local_208;
  allocator local_1f9;
  string local_1f8;
  ByteData local_1d8;
  ScriptWitness local_1c0;
  OutPoint local_1a0;
  uint32_t local_174;
  Transaction *local_170;
  undefined1 local_162;
  allocator local_161;
  string local_160 [38];
  byte local_13a;
  allocator local_139;
  string local_138;
  Txid local_118;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [52];
  undefined4 local_34;
  uint32_t local_30;
  uint32_t local_2c;
  char *local_28;
  int local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"TransactionData",&local_69);
  cfd::capi::CheckBuffer
            (in_stack_fffffffffffffcd0,
             (string *)
             CONCAT17(in_stack_fffffffffffffccf,
                      CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  if (in_stack_00000008 == (char *)0x0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x27b;
    local_90.funcname = "CfdUpdateWitnessStack";
    cfd::core::logger::warn<>(&local_90,"stack_item is null or empty.");
    local_b2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,"Failed to parameter. stack_item is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffbe0,error_code,in_stack_fffffffffffffbd0);
    local_b2 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(local_28);
  if (bVar2) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x281;
    local_d0.funcname = "CfdUpdateWitnessStack";
    cfd::core::logger::warn<>(&local_d0,"txid is null or empty.");
    local_f2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Failed to parameter. txid is null or empty.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffbe0,error_code,in_stack_fffffffffffffbd0);
    local_f2 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,local_28,&local_139);
  cfd::core::Txid::Txid(&local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  local_13a = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffc24,in_stack_fffffffffffffc18);
  if (*(long *)(local_78 + 0x18) == 0) {
    local_162 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"Invalid handle state. tx is null",&local_161);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffbe0,error_code,in_stack_fffffffffffffbd0);
    local_162 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_13a & 1) == 0) {
    pCVar6 = *(ConfidentialTransaction **)(local_78 + 0x18);
    local_208 = pCVar6;
    cfd::core::OutPoint::OutPoint(&local_238,&local_118,local_2c);
    uVar3 = (*(pCVar6->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])(pCVar6,&local_238)
    ;
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x60a826);
    pCVar6 = local_208;
    local_20c = uVar3;
    if (local_1c == 0) {
      paVar5 = &local_291;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_290,in_stack_00000008,paVar5);
      cfd::core::ByteData::ByteData(&local_270,&local_290);
      cfd::core::ConfidentialTransaction::SetScriptWitnessStack
                (&local_258,pCVar6,uVar3,local_30,&local_270);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x60a8e2);
      cfd::core::ByteData::~ByteData((ByteData *)0x60a8ef);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
    }
    else {
      if (local_1c != 1) {
        local_310.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
        local_310.filename = local_310.filename + 1;
        local_310.line = 0x29c;
        local_310.funcname = "CfdUpdateWitnessStack";
        cfd::core::logger::warn<int&>(&local_310,"Invalid stack type[{}]",&local_1c);
        message = (string *)__cxa_allocate_exception(0x30);
        paVar5 = (allocator *)&stack0xfffffffffffffccf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffcd0,"Invalid stack type.",paVar5);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffffbe0,(CfdError)((ulong)paVar5 >> 0x20),message);
        __cxa_throw(message,&cfd::core::CfdException::typeinfo,
                    cfd::core::CfdException::~CfdException);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f0,in_stack_00000008,&local_2f1);
      cfd::core::ByteData::ByteData(&local_2d0,&local_2f0);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                (&local_2b8,pCVar6,uVar3,local_30,&local_2d0);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x60aa51);
      cfd::core::ByteData::~ByteData((ByteData *)0x60aa5e);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    }
  }
  else {
    pTVar1 = *(Transaction **)(local_78 + 0x18);
    local_170 = pTVar1;
    cfd::core::OutPoint::OutPoint(&local_1a0,&local_118,local_2c);
    uVar3 = (*(pTVar1->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])(pTVar1,&local_1a0)
    ;
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x60a637);
    pTVar1 = local_170;
    local_174 = uVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,in_stack_00000008,&local_1f9);
    cfd::core::ByteData::ByteData(&local_1d8,&local_1f8);
    cfd::core::Transaction::SetScriptWitnessStack(&local_1c0,pTVar1,uVar3,local_30,&local_1d8);
    cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x60a700);
    cfd::core::ByteData::~ByteData((ByteData *)0x60a70d);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  local_4 = 0;
  cfd::core::Txid::~Txid((Txid *)0x60ac39);
  return local_4;
}

Assistant:

int CfdUpdateWitnessStack(
    void* handle, void* create_handle, int stack_type, const char* txid,
    uint32_t vout, uint32_t stack_index, const char* stack_item) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (stack_item == nullptr) {
      warn(CFD_LOG_SOURCE, "stack_item is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack_item is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      uint32_t index = tx->GetTxInIndex(OutPoint(txid_obj, vout));
      tx->SetScriptWitnessStack(index, stack_index, ByteData(stack_item));
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      uint32_t index = tx->GetTxInIndex(OutPoint(txid_obj, vout));
      if (stack_type == kCfdTxWitnessStackNormal) {
        tx->SetScriptWitnessStack(index, stack_index, ByteData(stack_item));
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        tx->SetPeginWitnessStack(index, stack_index, ByteData(stack_item));
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}